

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall qclab::qgates::QRotationGate1<float>::QRotationGate1(QRotationGate1<float> *this)

{
  QRotationGate1<float> *this_local;
  
  QGate1<float>::QGate1(&this->super_QGate1<float>,0);
  QAdjustable::QAdjustable((QAdjustable *)&(this->super_QGate1<float>).field_0xc,false);
  (this->super_QGate1<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00755f28;
  QRotation<float>::QRotation(&this->rotation_);
  return;
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }